

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

CURLcode Curl_ssl_peer_key_make(Curl_cfilter *cf,ssl_peer *peer,char *tls_id,char **ppeer_key)

{
  char *pcVar1;
  CURLcode local_60;
  _Bool local_59;
  CURLcode r;
  _Bool is_local;
  size_t key_len;
  dynbuf buf;
  ssl_primary_config *ssl;
  char **ppeer_key_local;
  char *tls_id_local;
  ssl_peer *peer_local;
  Curl_cfilter *cf_local;
  
  buf.toobig = (size_t)Curl_ssl_cf_get_primary_config(cf);
  local_59 = false;
  *ppeer_key = (char *)0x0;
  Curl_dyn_init((dynbuf *)&key_len,0x2800);
  local_60 = Curl_dyn_addf((dynbuf *)&key_len,"%s:%d",peer->hostname,(ulong)(uint)peer->port);
  if (local_60 == CURLE_OK) {
    switch(peer->transport) {
    case 3:
      break;
    case 4:
      local_60 = Curl_dyn_add((dynbuf *)&key_len,":UDP");
      break;
    case 5:
      local_60 = Curl_dyn_add((dynbuf *)&key_len,":QUIC");
      break;
    case 6:
      local_60 = Curl_dyn_add((dynbuf *)&key_len,":UNIX");
      break;
    default:
      local_60 = Curl_dyn_addf((dynbuf *)&key_len,":TRNSPRT-%d",(ulong)(uint)peer->transport);
    }
    if ((((((local_60 == CURLE_OK) &&
           (((*(byte *)(buf.toobig + 0x79) & 1) != 0 ||
            (local_60 = Curl_dyn_add((dynbuf *)&key_len,":NO-VRFY-PEER"), local_60 == CURLE_OK))))
          && (((*(byte *)(buf.toobig + 0x79) >> 1 & 1) != 0 ||
              (local_60 = Curl_dyn_add((dynbuf *)&key_len,":NO-VRFY-HOST"), local_60 == CURLE_OK))))
         && (((*(byte *)(buf.toobig + 0x79) >> 2 & 1) == 0 ||
             (local_60 = Curl_dyn_add((dynbuf *)&key_len,":VRFY-STATUS"), local_60 == CURLE_OK))))
        && (((((*(byte *)(buf.toobig + 0x79) & 1) != 0 &&
              ((*(byte *)(buf.toobig + 0x79) >> 1 & 1) != 0)) ||
             (((((ulong)cf->conn->bits >> 8 & 1) == 0 ||
               (local_60 = Curl_dyn_addf((dynbuf *)&key_len,":CHOST-%s",
                                         (cf->conn->conn_to_host).name), local_60 == CURLE_OK)) &&
              ((((ulong)cf->conn->bits >> 9 & 1) == 0 ||
               (local_60 = Curl_dyn_addf((dynbuf *)&key_len,":CPORT-%d",
                                         (ulong)(uint)cf->conn->conn_to_port), local_60 == CURLE_OK)
               ))))) &&
            ((((((*(char *)(buf.toobig + 0x78) == '\0' && (*(int *)(buf.toobig + 0x74) == 0)) ||
                (local_60 = Curl_dyn_addf((dynbuf *)&key_len,":TLSVER-%d-%d",
                                          (ulong)*(byte *)(buf.toobig + 0x78),
                                          (ulong)(*(uint *)(buf.toobig + 0x74) >> 0x10)),
                local_60 == CURLE_OK)) &&
               ((*(char *)(buf.toobig + 0x70) == '\0' ||
                (local_60 = Curl_dyn_addf((dynbuf *)&key_len,":TLSOPT-%x",
                                          (ulong)*(byte *)(buf.toobig + 0x70)), local_60 == CURLE_OK
                )))) && (((*(long *)(buf.toobig + 0x20) == 0 ||
                          (local_60 = Curl_dyn_addf((dynbuf *)&key_len,":CIPHER-%s",
                                                    *(undefined8 *)(buf.toobig + 0x20)),
                          local_60 == CURLE_OK)) &&
                         ((*(long *)(buf.toobig + 0x28) == 0 ||
                          (local_60 = Curl_dyn_addf((dynbuf *)&key_len,":CIPHER13-%s",
                                                    *(undefined8 *)(buf.toobig + 0x28)),
                          local_60 == CURLE_OK)))))) &&
             ((*(long *)(buf.toobig + 0x68) == 0 ||
              (local_60 = Curl_dyn_addf((dynbuf *)&key_len,":CURVES-%s",
                                        *(undefined8 *)(buf.toobig + 0x68)), local_60 == CURLE_OK)))
             ))))) &&
       ((((*(byte *)(buf.toobig + 0x79) & 1) == 0 ||
         (((((local_60 = cf_ssl_peer_key_add_path
                                   ((dynbuf *)&key_len,"CA",*(char **)(buf.toobig + 8),&local_59),
             local_60 == CURLE_OK &&
             (local_60 = cf_ssl_peer_key_add_path
                                   ((dynbuf *)&key_len,"CApath",*(char **)buf.toobig,&local_59),
             local_60 == CURLE_OK)) &&
            (local_60 = cf_ssl_peer_key_add_path
                                  ((dynbuf *)&key_len,"CRL",*(char **)(buf.toobig + 0x38),&local_59)
            , local_60 == CURLE_OK)) &&
           ((local_60 = cf_ssl_peer_key_add_path
                                  ((dynbuf *)&key_len,"Issuer",*(char **)(buf.toobig + 0x10),
                                   &local_59), local_60 == CURLE_OK &&
            ((*(long *)(buf.toobig + 0x40) == 0 ||
             (local_60 = cf_ssl_peer_key_add_hash
                                   ((dynbuf *)&key_len,"CertBlob",*(curl_blob **)(buf.toobig + 0x40)
                                   ), local_60 == CURLE_OK)))))) &&
          (((*(long *)(buf.toobig + 0x48) == 0 ||
            (local_60 = cf_ssl_peer_key_add_hash
                                  ((dynbuf *)&key_len,"CAInfoBlob",
                                   *(curl_blob **)(buf.toobig + 0x48)), local_60 == CURLE_OK)) &&
           ((*(long *)(buf.toobig + 0x50) == 0 ||
            (local_60 = cf_ssl_peer_key_add_hash
                                  ((dynbuf *)&key_len,"IssuerBlob",
                                   *(curl_blob **)(buf.toobig + 0x50)), local_60 == CURLE_OK))))))))
        && ((((*(long *)(buf.toobig + 0x30) == 0 ||
              ((**(char **)(buf.toobig + 0x30) == '\0' ||
               (local_60 = Curl_dyn_addf((dynbuf *)&key_len,":Pinned-%s",
                                         *(undefined8 *)(buf.toobig + 0x30)), local_60 == CURLE_OK))
              )) && ((*(long *)(buf.toobig + 0x18) == 0 ||
                     ((**(char **)(buf.toobig + 0x18) == '\0' ||
                      (local_60 = Curl_dyn_add((dynbuf *)&key_len,":CCERT"), local_60 == CURLE_OK)))
                     ))) &&
            (((*(long *)(buf.toobig + 0x58) == 0 && (*(long *)(buf.toobig + 0x60) == 0)) ||
             (local_60 = Curl_dyn_add((dynbuf *)&key_len,":SRP-AUTH"), local_60 == CURLE_OK))))))))
    {
      if ((tls_id == (char *)0x0) || (*tls_id == '\0')) {
        local_60 = CURLE_FAILED_INIT;
      }
      else {
        local_60 = Curl_dyn_addf((dynbuf *)&key_len,":IMPL-%s",tls_id);
        if (local_60 == CURLE_OK) {
          pcVar1 = ":G";
          if ((local_59 & 1U) != 0) {
            pcVar1 = ":L";
          }
          local_60 = Curl_dyn_addf((dynbuf *)&key_len,pcVar1);
          if (local_60 == CURLE_OK) {
            pcVar1 = Curl_dyn_take((dynbuf *)&key_len,(size_t *)&r);
            *ppeer_key = pcVar1;
          }
        }
      }
    }
  }
  Curl_dyn_free((dynbuf *)&key_len);
  return local_60;
}

Assistant:

CURLcode Curl_ssl_peer_key_make(struct Curl_cfilter *cf,
                                const struct ssl_peer *peer,
                                const char *tls_id,
                                char **ppeer_key)
{
  struct ssl_primary_config *ssl = Curl_ssl_cf_get_primary_config(cf);
  struct dynbuf buf;
  size_t key_len;
  bool is_local = FALSE;
  CURLcode r;

  *ppeer_key = NULL;
  Curl_dyn_init(&buf, 10 * 1024);

  r = Curl_dyn_addf(&buf, "%s:%d", peer->hostname, peer->port);
  if(r)
    goto out;

  switch(peer->transport) {
  case TRNSPRT_TCP:
    break;
  case TRNSPRT_UDP:
    r = Curl_dyn_add(&buf, ":UDP");
    break;
  case TRNSPRT_QUIC:
    r = Curl_dyn_add(&buf, ":QUIC");
    break;
  case TRNSPRT_UNIX:
    r = Curl_dyn_add(&buf, ":UNIX");
    break;
  default:
    r = Curl_dyn_addf(&buf, ":TRNSPRT-%d", peer->transport);
    break;
  }
  if(r)
    goto out;

  if(!ssl->verifypeer) {
    r = Curl_dyn_add(&buf, ":NO-VRFY-PEER");
    if(r)
      goto out;
  }
  if(!ssl->verifyhost) {
    r = Curl_dyn_add(&buf, ":NO-VRFY-HOST");
    if(r)
      goto out;
  }
  if(ssl->verifystatus) {
    r = Curl_dyn_add(&buf, ":VRFY-STATUS");
    if(r)
      goto out;
  }
  if(!ssl->verifypeer || !ssl->verifyhost) {
    if(cf->conn->bits.conn_to_host) {
      r = Curl_dyn_addf(&buf, ":CHOST-%s", cf->conn->conn_to_host.name);
      if(r)
        goto out;
    }
    if(cf->conn->bits.conn_to_port) {
      r = Curl_dyn_addf(&buf, ":CPORT-%d", cf->conn->conn_to_port);
      if(r)
        goto out;
    }
  }

  if(ssl->version || ssl->version_max) {
    r = Curl_dyn_addf(&buf, ":TLSVER-%d-%d", ssl->version,
                      (ssl->version_max >> 16));
    if(r)
      goto out;
  }
  if(ssl->ssl_options) {
    r = Curl_dyn_addf(&buf, ":TLSOPT-%x", ssl->ssl_options);
    if(r)
      goto out;
  }
  if(ssl->cipher_list) {
    r = Curl_dyn_addf(&buf, ":CIPHER-%s", ssl->cipher_list);
    if(r)
      goto out;
  }
  if(ssl->cipher_list13) {
    r = Curl_dyn_addf(&buf, ":CIPHER13-%s", ssl->cipher_list13);
    if(r)
      goto out;
  }
  if(ssl->curves) {
    r = Curl_dyn_addf(&buf, ":CURVES-%s", ssl->curves);
    if(r)
      goto out;
  }
  if(ssl->verifypeer) {
    r = cf_ssl_peer_key_add_path(&buf, "CA", ssl->CAfile, &is_local);
    if(r)
      goto out;
    r = cf_ssl_peer_key_add_path(&buf, "CApath", ssl->CApath, &is_local);
    if(r)
      goto out;
    r = cf_ssl_peer_key_add_path(&buf, "CRL", ssl->CRLfile, &is_local);
    if(r)
      goto out;
    r = cf_ssl_peer_key_add_path(&buf, "Issuer", ssl->issuercert, &is_local);
    if(r)
      goto out;
    if(ssl->cert_blob) {
      r = cf_ssl_peer_key_add_hash(&buf, "CertBlob", ssl->cert_blob);
      if(r)
        goto out;
    }
    if(ssl->ca_info_blob) {
      r = cf_ssl_peer_key_add_hash(&buf, "CAInfoBlob", ssl->ca_info_blob);
      if(r)
        goto out;
    }
    if(ssl->issuercert_blob) {
      r = cf_ssl_peer_key_add_hash(&buf, "IssuerBlob", ssl->issuercert_blob);
      if(r)
        goto out;
    }
  }
  if(ssl->pinned_key && ssl->pinned_key[0]) {
    r = Curl_dyn_addf(&buf, ":Pinned-%s", ssl->pinned_key);
    if(r)
      goto out;
  }

  if(ssl->clientcert && ssl->clientcert[0]) {
    r = Curl_dyn_add(&buf, ":CCERT");
    if(r)
      goto out;
  }
#ifdef USE_TLS_SRP
  if(ssl->username || ssl->password) {
    r = Curl_dyn_add(&buf, ":SRP-AUTH");
    if(r)
      goto out;
  }
#endif

  if(!tls_id || !tls_id[0]) {
    r = CURLE_FAILED_INIT;
    goto out;
  }
  r = Curl_dyn_addf(&buf, ":IMPL-%s", tls_id);
  if(r)
    goto out;

  r = Curl_dyn_addf(&buf, is_local ?
                    CURL_SSLS_LOCAL_SUFFIX : CURL_SSLS_GLOBAL_SUFFIX);
  if(r)
    goto out;

  *ppeer_key = Curl_dyn_take(&buf, &key_len);
  /* we just added printable char, and dynbuf always 0 terminates,
   * no need to track length */


out:
  Curl_dyn_free(&buf);
  return r;
}